

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O0

void __thiscall
gimage::JPEGImageIO::load
          (JPEGImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  int *piVar5;
  long *plVar6;
  long lVar7;
  char *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  ulong in_stack_00000008;
  ulong in_stack_00000010;
  int d_2;
  long i_2;
  int j_2;
  long k_2;
  int d_1;
  long i_1;
  long j;
  store_t v;
  int d;
  int ii;
  long i;
  long j_1;
  int jj;
  long kk;
  long k_1;
  long k;
  valarray<int> nline;
  valarray<int> vline;
  FILE *in;
  JSAMPROW row;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  int depth;
  long height;
  long width;
  int *in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b8;
  valarray<int> *in_stack_fffffffffffff9c0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffff9d0;
  long k_00;
  string *in_stack_fffffffffffff9e8;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  long in_stack_fffffffffffff9f8;
  long in_stack_fffffffffffffa00;
  long in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  int local_574;
  long local_570;
  int local_564;
  long local_560;
  int local_554;
  long local_550 [3];
  long local_538 [3];
  byte local_519;
  int local_518;
  int local_514;
  long local_510 [3];
  long local_4f8 [3];
  long local_4e0;
  int local_4d4;
  long local_4d0;
  undefined4 local_4c8;
  undefined4 local_4c4;
  long local_4c0 [3];
  long local_4a8;
  undefined4 local_49c;
  valarray<int> local_498;
  undefined4 local_484;
  valarray<int> local_480;
  int local_470;
  undefined1 local_46a;
  allocator local_469;
  string local_468 [99];
  undefined1 local_405;
  allocator local_3f1;
  string local_3f0 [96];
  FILE *local_390;
  void *local_388;
  undefined1 local_380 [168];
  undefined8 local_2d8 [9];
  undefined4 local_290;
  uint local_250;
  uint local_24c;
  int local_244;
  uint local_230;
  int local_44;
  ulong local_40;
  ulong local_38;
  long local_30;
  long local_28;
  int local_1c;
  char *local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_388 = (void *)0x0;
  local_390 = (FILE *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,1);
  if ((uVar3 & 1) == 0) {
    local_405 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f0,local_18,&local_3f1);
    std::operator+((char *)in_stack_fffffffffffff9b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    std::operator+(in_stack_fffffffffffff9b8,
                   (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    gutil::IOException::IOException
              ((IOException *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
               in_stack_fffffffffffff9e8);
    local_405 = 0;
    __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_390 = fopen(local_18,"rb");
  if (local_390 == (FILE *)0x0) {
    local_46a = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_468,local_18,&local_469);
    std::operator+((char *)in_stack_fffffffffffff9b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    std::operator+(in_stack_fffffffffffff9b8,
                   (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    gutil::IOException::IOException
              ((IOException *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
               in_stack_fffffffffffff9e8);
    local_46a = 0;
    __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_2d8[0] = jpeg_std_error(local_380);
  jpeg_CreateDecompress(local_2d8,0x50,0x290);
  jpeg_stdio_src(local_2d8,local_390);
  jpeg_read_header(local_2d8,1);
  local_470 = 1;
  piVar5 = std::max<int>(&local_470,&local_1c);
  local_1c = *piVar5;
  if (1 < local_1c) {
    if (local_1c % 8 == 0) {
      local_290 = 8;
      local_1c = local_1c / 8;
    }
    else if (local_1c % 4 == 0) {
      local_290 = 4;
      local_1c = local_1c / 4;
    }
    else if (local_1c % 2 == 0) {
      local_290 = 2;
      local_1c = local_1c / 2;
    }
  }
  jpeg_start_decompress(local_2d8);
  local_38 = (ulong)local_250;
  local_40 = (ulong)local_24c;
  local_44 = local_244;
  if ((long)in_stack_00000008 < 0) {
    in_stack_00000008 = (long)(local_38 + (long)local_1c + -1) / (long)local_1c;
  }
  if ((long)in_stack_00000010 < 0) {
    in_stack_00000010 = (long)(local_40 + (long)local_1c + -1) / (long)local_1c;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),in_stack_fffffffffffffa08
             ,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_stack_fffffffffffff9d0);
  uVar3 = local_38 * (long)local_44;
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_388 = operator_new__(uVar3);
  if ((((local_1c < 2) && (local_28 == 0)) && (local_30 == 0)) &&
     ((in_stack_00000008 == local_38 && (in_stack_00000010 == local_40)))) {
    for (local_560 = 0; local_560 < (long)local_40; local_560 = local_560 + 1) {
      jpeg_read_scanlines(local_2d8,&local_388,1);
      local_564 = 0;
      for (local_570 = 0; local_570 < (long)local_38; local_570 = local_570 + 1) {
        for (local_574 = 0; local_574 < local_44; local_574 = local_574 + 1) {
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_10,local_570,local_560,local_574,
                     *(store_t *)((long)local_388 + (long)local_564));
          local_564 = local_564 + 1;
        }
      }
    }
    jpeg_finish_decompress(local_2d8);
  }
  else {
    local_484 = 0;
    std::valarray<int>::valarray
              (in_stack_fffffffffffff9c0,(int *)in_stack_fffffffffffff9b8,
               CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    local_49c = 0;
    std::valarray<int>::valarray
              (in_stack_fffffffffffff9c0,(int *)in_stack_fffffffffffff9b8,
               CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    for (local_4a8 = 0; local_4a8 < local_30 * local_1c && local_4a8 < (long)local_40;
        local_4a8 = local_4a8 + 1) {
      jpeg_read_scanlines(local_2d8,&local_388,1);
    }
    local_4c0[1] = 0;
    local_4c0[0] = -local_30;
    plVar6 = std::max<long>(local_4c0 + 1,local_4c0);
    for (local_4c0[2] = *plVar6;
        local_4c0[2] < (long)in_stack_00000010 &&
        (local_30 + local_4c0[2]) * (long)local_1c < (long)local_40; local_4c0[2] = local_4c0[2] + 1
        ) {
      local_4c4 = 0;
      std::valarray<int>::operator=
                ((valarray<int> *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                 in_stack_fffffffffffff9a8);
      local_4c8 = 0;
      std::valarray<int>::operator=
                ((valarray<int> *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                 in_stack_fffffffffffff9a8);
      local_4d0 = 0;
      while( true ) {
        bVar1 = false;
        if (local_4d0 < local_1c) {
          bVar1 = local_4d0 + (local_30 + local_4c0[2]) * (long)local_1c < (long)local_40;
        }
        if (!bVar1) break;
        jpeg_read_scanlines(local_2d8,&local_388,1);
        local_4e0 = 0;
        plVar6 = std::max<long>(&local_4e0,&local_28);
        local_4d4 = (int)*plVar6 * local_1c * local_44;
        local_4f8[1] = 0;
        local_4f8[0] = -local_28;
        plVar6 = std::max<long>(local_4f8 + 1,local_4f8);
        local_4f8[2] = *plVar6 * (long)local_44;
        local_510[1] = 0;
        local_510[0] = -local_28;
        plVar6 = std::max<long>(local_510 + 1,local_510);
        for (local_510[2] = *plVar6;
            local_510[2] < (long)in_stack_00000008 &&
            (local_28 + local_510[2]) * (long)local_1c < (long)local_38;
            local_510[2] = local_510[2] + 1) {
          local_514 = 0;
          while( true ) {
            bVar1 = false;
            if (local_514 < local_1c) {
              bVar1 = (local_28 + local_510[2]) * (long)local_1c + (long)local_514 < (long)local_38;
            }
            if (!bVar1) break;
            for (local_518 = 0; local_518 < local_44; local_518 = local_518 + 1) {
              lVar7 = (long)local_4d4;
              local_4d4 = local_4d4 + 1;
              local_519 = *(byte *)((long)local_388 + lVar7);
              bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidS
                                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                                 (store_t)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
              if (bVar1) {
                uVar2 = (uint)local_519;
                piVar5 = std::valarray<int>::operator[](&local_480,local_4f8[2] + local_518);
                *piVar5 = *piVar5 + uVar2;
                piVar5 = std::valarray<int>::operator[](&local_498,local_4f8[2] + local_518);
                *piVar5 = *piVar5 + 1;
              }
            }
            local_514 = local_514 + 1;
          }
          local_4f8[2] = local_44 + local_4f8[2];
        }
        local_4d0 = local_4d0 + 1;
      }
      local_538[1] = 0;
      local_538[0] = -local_28;
      plVar6 = std::max<long>(local_538 + 1,local_538);
      local_538[2] = *plVar6 * (long)local_44;
      local_550[1] = 0;
      local_550[0] = -local_28;
      plVar6 = std::max<long>(local_550 + 1,local_550);
      for (local_550[2] = *plVar6;
          local_550[2] < (long)in_stack_00000008 &&
          (local_28 + local_550[2]) * (long)local_1c < (long)local_38;
          local_550[2] = local_550[2] + 1) {
        for (local_554 = 0; local_554 < local_44; local_554 = local_554 + 1) {
          piVar5 = std::valarray<int>::operator[](&local_498,local_538[2]);
          lVar7 = local_550[2];
          if (0 < *piVar5) {
            this_00 = local_10;
            k_00 = local_4c0[2];
            piVar5 = std::valarray<int>::operator[](&local_480,local_538[2]);
            in_stack_fffffffffffff9b4 = *piVar5;
            piVar5 = std::valarray<int>::operator[](&local_498,local_538[2]);
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (this_00,lVar7,k_00,local_554,(store_t)(in_stack_fffffffffffff9b4 / *piVar5));
          }
          local_538[2] = local_538[2] + 1;
        }
      }
    }
    if (local_230 < local_24c) {
      jpeg_abort_decompress(local_2d8);
    }
    else {
      jpeg_finish_decompress(local_2d8);
    }
    std::valarray<int>::~valarray
              ((valarray<int> *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    std::valarray<int>::~valarray
              ((valarray<int> *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
  }
  jpeg_destroy_decompress(local_2d8);
  fclose(local_390);
  if (local_388 != (void *)0x0) {
    operator_delete__(local_388);
  }
  return;
}

Assistant:

void JPEGImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                       long w, long h) const
{
  long  width, height;
  int   depth;
  struct jpeg_decompress_struct cinfo;
  struct jpeg_error_mgr jerr;
  JSAMPROW row=0;
  FILE   *in=0;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load JPG image ("+std::string(name)+")");
  }

  // open output file using C methods

  in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file for reading ("+std::string(name)+")");
  }

  // installing standard error handler, create compression object and set output file

  cinfo.err=jpeg_std_error(&jerr);
  jpeg_create_decompress(&cinfo);
  jpeg_stdio_src(&cinfo, in);

  // read header information

  jpeg_read_header(&cinfo, TRUE);

  // use scaling possibility of JPEG library for increasing speed

  ds=std::max(1, ds);

  if (ds > 1)
  {
    if (ds%8 == 0)
    {
      cinfo.scale_denom=8;
      ds/=8;
    }
    else if (ds%4 == 0)
    {
      cinfo.scale_denom=4;
      ds/=4;
    }
    else if (ds%2 == 0)
    {
      cinfo.scale_denom=2;
      ds/=2;
    }
  }

  // start decompression

  jpeg_start_decompress(&cinfo);

  // get size and depth

  width=static_cast<long>(cinfo.output_width);
  height=static_cast<long>(cinfo.output_height);
  depth=cinfo.output_components;

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // allocate image row buffer

  row=new JSAMPLE [width*depth];

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU8::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    for (long k=0; k<y*ds && k<height; k++)
    {
      jpeg_read_scanlines(&cinfo, &row, 1);
    }

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        jpeg_read_scanlines(&cinfo, &row, 1);

        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(row[jj++]);

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
          }

          j++;
        }
      }
    }

    if (cinfo.output_scanline < cinfo.output_height)
    {
      jpeg_abort_decompress(&cinfo);
    }
    else
    {
      jpeg_finish_decompress(&cinfo);
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      jpeg_read_scanlines(&cinfo, &row, 1);

      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          image.set(i, k, d, static_cast<ImageU8::store_t>(row[j++]));
        }
      }
    }

    jpeg_finish_decompress(&cinfo);
  }

  // close object and input stream

  jpeg_destroy_decompress(&cinfo);
  fclose(in);
  delete [] row;
}